

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.c
# Opt level: O1

void tommy_list_sort(tommy_list *list,undefined1 *cmp)

{
  tommy_list ptVar1;
  tommy_node_struct *ptVar2;
  tommy_node_struct *ptVar3;
  tommy_node_struct *ptVar4;
  tommy_node_struct *ptVar5;
  tommy_list ptVar6;
  long *plVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  tommy_list ptVar19;
  uint uVar20;
  ulong uVar21;
  tommy_node_struct *ptVar22;
  long *plVar23;
  tommy_node *first_i_1;
  tommy_list *pptVar24;
  tommy_list *pptVar25;
  long *plVar26;
  tommy_node *first_i;
  tommy_node_struct *ptVar27;
  undefined8 *puVar28;
  long in_FS_OFFSET;
  bool bVar29;
  undefined8 local_248;
  undefined8 local_240;
  tommy_list local_48;
  tommy_list ptStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar19 = *list;
  if (ptVar19 != (tommy_list)0x0) {
    ptVar1 = ptVar19->prev;
    uVar21 = 0;
    do {
      pptVar25 = &local_48;
      local_48 = ptVar19;
      ptStack_40 = ptVar19;
      ptVar2 = ptVar19->next;
      if ((uVar21 & 1) == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        uVar17 = uVar21;
        pptVar24 = pptVar25;
        do {
          pptVar25 = (tommy_list *)(&local_248 + uVar16 * 2);
          ptVar3 = (tommy_node_struct *)(&local_240)[uVar16 * 2];
          iVar15 = (*(code *)cmp)(ptVar3->data,(*pptVar24)->data);
          if (iVar15 < 1) {
            ptVar6 = *pptVar24;
            ptVar6->prev = ptVar3;
            ptVar3->next = ptVar6;
            (&local_240)[uVar16 * 2] = pptVar24[1];
          }
          else {
            ptVar27 = *pptVar25;
            iVar15 = (*(code *)cmp)(pptVar24[1]->data,ptVar27->data);
            if (iVar15 < 0) {
              ptVar3 = pptVar24[1];
              ptVar27->prev = ptVar3;
              ptVar3->next = ptVar27;
              *pptVar25 = *pptVar24;
            }
            else {
              ptVar22 = *pptVar24;
              do {
                while (iVar15 = (*(code *)cmp)(ptVar27->data,ptVar22->data), iVar15 < 1) {
                  if (ptVar27 == ptVar3) {
                    ptVar22->prev = ptVar27;
                    ptVar27->next = ptVar22;
                    (&local_240)[uVar16 * 2] = pptVar24[1];
                    goto LAB_0010f0c4;
                  }
                  ptVar27 = ptVar27->next;
                }
                ptVar4 = ptVar22->next;
                if (ptVar27 == *pptVar25) {
                  ptVar27->prev = ptVar22;
                  ptVar22->next = ptVar27;
                  *pptVar25 = ptVar22;
                }
                else {
                  ptVar5 = ptVar27->prev;
                  ptVar27->prev = ptVar22;
                  ptVar22->prev = ptVar5;
                  ptVar5->next = ptVar22;
                  ptVar22->next = ptVar27;
                }
                bVar29 = ptVar22 != pptVar24[1];
                ptVar22 = ptVar4;
              } while (bVar29);
            }
          }
LAB_0010f0c4:
          uVar16 = (ulong)((int)uVar16 + 1);
          uVar14 = uVar17 & 2;
          uVar17 = uVar17 >> 1;
          pptVar24 = pptVar25;
        } while (uVar14 != 0);
      }
      uVar11 = *(undefined4 *)((long)pptVar25 + 4);
      uVar12 = *(undefined4 *)(pptVar25 + 1);
      uVar13 = *(undefined4 *)((long)pptVar25 + 0xc);
      *(undefined4 *)(&local_248 + uVar16 * 2) = *(undefined4 *)pptVar25;
      *(undefined4 *)((long)&local_248 + uVar16 * 0x10 + 4) = uVar11;
      *(undefined4 *)(&local_240 + uVar16 * 2) = uVar12;
      *(undefined4 *)((long)&local_240 + uVar16 * 0x10 + 4) = uVar13;
      uVar20 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar20;
      bVar29 = ptVar19 != ptVar1;
      ptVar19 = ptVar2;
    } while (bVar29);
    uVar10 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar17 = (ulong)uVar10;
    for (uVar21 = (ulong)(uVar20 >> ((byte)uVar10 & 0x1f)); (int)uVar21 != 1; uVar21 = uVar21 >> 1)
    {
      uVar16 = (ulong)((int)uVar17 + 1);
      plVar23 = &local_248 + uVar16 * 2;
      if ((uVar21 & 2) == 0) {
        uVar11 = *(undefined4 *)((long)&local_248 + uVar17 * 0x10 + 4);
        uVar12 = *(undefined4 *)(&local_240 + uVar17 * 2);
        uVar13 = *(undefined4 *)((long)&local_240 + uVar17 * 0x10 + 4);
        *(undefined4 *)plVar23 = *(undefined4 *)(&local_248 + uVar17 * 2);
        *(undefined4 *)((long)&local_248 + uVar16 * 0x10 + 4) = uVar11;
        *(undefined4 *)(&local_240 + uVar16 * 2) = uVar12;
        *(undefined4 *)((long)&local_240 + uVar16 * 0x10 + 4) = uVar13;
      }
      else {
        plVar7 = (long *)(&local_240)[uVar16 * 2];
        puVar28 = (undefined8 *)(&local_248)[uVar17 * 2];
        iVar15 = (*(code *)cmp)(plVar7[2],puVar28[2]);
        if (iVar15 < 1) {
          puVar28[1] = plVar7;
          *plVar7 = (long)puVar28;
          puVar18 = (undefined8 *)(&local_240)[uVar17 * 2];
LAB_0010f203:
          (&local_240)[uVar16 * 2] = puVar18;
        }
        else {
          puVar18 = (undefined8 *)(&local_240)[uVar17 * 2];
          plVar26 = (long *)*plVar23;
          iVar15 = (*(code *)cmp)(puVar18[2],plVar26[2]);
          if (iVar15 < 0) {
            plVar26[1] = (long)puVar18;
            *puVar18 = plVar26;
            *plVar23 = (long)puVar28;
          }
          else {
            do {
              while (iVar15 = (*(code *)cmp)(plVar26[2],puVar28[2]), iVar15 < 1) {
                if (plVar26 == plVar7) {
                  puVar28[1] = plVar26;
                  *plVar26 = (long)puVar28;
                  goto LAB_0010f203;
                }
                plVar26 = (long *)*plVar26;
              }
              puVar8 = (undefined8 *)*puVar28;
              if (plVar26 == (long *)*plVar23) {
                plVar26[1] = (long)puVar28;
                *puVar28 = plVar26;
                *plVar23 = (long)puVar28;
              }
              else {
                puVar9 = (undefined8 *)plVar26[1];
                plVar26[1] = (long)puVar28;
                puVar28[1] = puVar9;
                *puVar9 = puVar28;
                *puVar28 = plVar26;
              }
              bVar29 = puVar28 != puVar18;
              puVar28 = puVar8;
            } while (bVar29);
          }
        }
      }
      uVar17 = uVar16;
    }
    ptVar19 = (tommy_list)(&local_248)[uVar17 * 2];
    ptVar2 = (tommy_node_struct *)(&local_240)[uVar17 * 2];
    ptVar19->prev = ptVar2;
    ptVar2->next = (tommy_node_struct *)0x0;
    *list = ptVar19;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_list_sort(tommy_list* list, tommy_compare_func* cmp)
{
	tommy_chain chain;
	tommy_node* head;

	if (tommy_list_empty(list))
		return;

	head = tommy_list_head(list);

	/* create a chain from the list */
	chain.head = head;
	chain.tail = head->prev;

	tommy_chain_mergesort(&chain, cmp);

	/* restore the list */
	tommy_list_set(list, chain.head, chain.tail);
}